

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesVFManagementGetVFPropertiesExp
          (zes_vf_handle_t hVFhandle,zes_vf_exp_properties_t *pProperties)

{
  zes_pfnVFManagementGetVFPropertiesExp_t pfnGetVFPropertiesExp;
  ze_result_t result;
  zes_vf_exp_properties_t *pProperties_local;
  zes_vf_handle_t hVFhandle_local;
  
  pfnGetVFPropertiesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ce18 != (code *)0x0) {
    pfnGetVFPropertiesExp._4_4_ = (*DAT_0011ce18)(hVFhandle,pProperties);
  }
  return pfnGetVFPropertiesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFPropertiesExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_properties_t* pProperties            ///< [in,out] Will contain VF properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVFPropertiesExp = context.zesDdiTable.VFManagementExp.pfnGetVFPropertiesExp;
        if( nullptr != pfnGetVFPropertiesExp )
        {
            result = pfnGetVFPropertiesExp( hVFhandle, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }